

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

char * uv__unknown_err_code(int err)

{
  char *pcVar1;
  char buf [32];
  
  snprintf(buf,0x20,"Unknown system error %d",err);
  pcVar1 = uv__strdup(buf);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "Unknown system error";
  }
  return pcVar1;
}

Assistant:

static const char* uv__unknown_err_code(int err) {
  char buf[32];
  char* copy;

  snprintf(buf, sizeof(buf), "Unknown system error %d", err);
  copy = uv__strdup(buf);

  return copy != NULL ? copy : "Unknown system error";
}